

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O2

void lodepng_info_init(LodePNGInfo *info)

{
  undefined1 auVar1 [64];
  
  (info->color).colortype = LCT_RGBA;
  (info->color).bitdepth = 8;
  (info->color).palette = (uchar *)0x0;
  (info->color).palettesize = 0;
  (info->color).key_defined = 0;
  (info->color).key_r = 0;
  (info->color).key_g = 0;
  (info->color).key_b = 0;
  info->interlace_method = 0;
  info->compression_method = 0;
  info->filter_method = 0;
  info->phys_defined = 0;
  auVar1 = ZEXT464(0) << 0x40;
  info->background_defined = auVar1._0_4_;
  info->background_r = auVar1._4_4_;
  info->background_g = auVar1._8_4_;
  info->background_b = auVar1._12_4_;
  info->text_num = auVar1._16_8_;
  info->text_keys = (char **)auVar1._24_8_;
  info->text_strings = (char **)auVar1._32_8_;
  info->itext_num = auVar1._40_8_;
  info->itext_keys = (char **)auVar1._48_8_;
  info->itext_langtags = (char **)auVar1._56_8_;
  *(undefined1 (*) [64])((long)&info->text_num + 4) = auVar1;
  LodePNGUnknownChunks_init(info);
  return;
}

Assistant:

void lodepng_info_init(LodePNGInfo* info)
{
  lodepng_color_mode_init(&info->color);
  info->interlace_method = 0;
  info->compression_method = 0;
  info->filter_method = 0;
#ifdef LODEPNG_COMPILE_ANCILLARY_CHUNKS
  info->background_defined = 0;
  info->background_r = info->background_g = info->background_b = 0;

  LodePNGText_init(info);
  LodePNGIText_init(info);

  info->time_defined = 0;
  info->phys_defined = 0;

  LodePNGUnknownChunks_init(info);
#endif /*LODEPNG_COMPILE_ANCILLARY_CHUNKS*/
}